

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove2<(moira::Instr)71,(moira::Mode)7,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  uint n;
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  int src;
  u32 data;
  u32 ea;
  u32 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = in_SI & 7;
  n = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)7,(moira::Size)1,0ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)(CONCAT44(in_stack_ffffffffffffffec,(uint)in_SI) & 0xffffffff00000007),
                     (u32 *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe0) & 0x7ffffffff
                            ));
  if (bVar1) {
    bVar1 = NBIT<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.n = bVar1;
    bVar1 = ZERO<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.z = bVar1;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
    bVar1 = writeOp<(moira::Mode)2,(moira::Size)1,64ul>
                      ((Moira *)CONCAT44(in_stack_ffffffffffffffec,uVar2),n,
                       in_stack_ffffffffffffffe0);
    if (bVar1) {
      bVar1 = NBIT<(moira::Size)1>((ulong)in_stack_ffffffffffffffec);
      (in_RDI->reg).sr.n = bVar1;
      bVar1 = ZERO<(moira::Size)1>((ulong)in_stack_ffffffffffffffec);
      (in_RDI->reg).sr.z = bVar1;
      (in_RDI->reg).sr.v = false;
      (in_RDI->reg).sr.c = false;
      prefetch<4ul>((Moira *)CONCAT44(n,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

void
Moira::execMove2(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_AI,S,AE_INC_PC> (dst, data)) return;
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}